

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O0

void save_load_sampling(boosting *o,io_buf *model_file,bool read,bool text)

{
  value_type vVar1;
  size_t sVar2;
  ostream *poVar3;
  void *pvVar4;
  reference pvVar5;
  byte in_CL;
  byte in_DL;
  long in_RSI;
  int *in_RDI;
  int i_2;
  stringstream os2_1;
  float f_1;
  int i_1;
  stringstream os2;
  float f;
  int i;
  stringstream os;
  undefined8 in_stack_fffffffffffffaa8;
  stringstream *in_stack_fffffffffffffab0;
  size_type in_stack_fffffffffffffab8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffac0;
  size_t in_stack_fffffffffffffac8;
  char *in_stack_fffffffffffffad0;
  io_buf *in_stack_fffffffffffffad8;
  int local_4d4;
  stringstream local_4d0 [16];
  stringstream local_4c0 [15];
  undefined1 in_stack_fffffffffffffb4f;
  stringstream *in_stack_fffffffffffffb50;
  size_t in_stack_fffffffffffffb58;
  char *in_stack_fffffffffffffb60;
  io_buf *in_stack_fffffffffffffb68;
  char *in_stack_fffffffffffffc70;
  size_t in_stack_fffffffffffffc78;
  char *in_stack_fffffffffffffc80;
  io_buf *in_stack_fffffffffffffc88;
  value_type local_348;
  int local_344;
  stringstream local_340 [16];
  ostream local_330;
  value_type local_1b4;
  int local_1b0;
  stringstream local_1a0 [16];
  ostream local_190;
  byte local_12;
  byte local_11;
  int *local_8;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_8 = in_RDI;
  sVar2 = v_array<int>::size((v_array<int> *)(in_RSI + 0x30));
  if (sVar2 != 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar3 = std::operator<<(&local_190,"boosts ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,*local_8);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    bin_text_read_write_fixed
              (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
               (char *)in_stack_fffffffffffffac0,SUB81(in_stack_fffffffffffffab8 >> 0x38,0),
               in_stack_fffffffffffffab0,SUB81((ulong)in_stack_fffffffffffffaa8 >> 0x38,0));
    if ((local_11 & 1) != 0) {
      std::vector<float,_std::allocator<float>_>::resize
                (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      std::vector<float,_std::allocator<float>_>::resize
                (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    }
    for (local_1b0 = 0; local_1b0 < *local_8; local_1b0 = local_1b0 + 1) {
      if ((local_11 & 1) == 0) {
        std::__cxx11::stringstream::stringstream(local_340);
        poVar3 = std::operator<<(&local_330,"alpha ");
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_8 + 0x12),
                            (long)local_1b0);
        pvVar4 = (void *)std::ostream::operator<<(poVar3,*pvVar5);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        std::vector<float,_std::allocator<float>_>::operator[]
                  ((vector<float,_std::allocator<float>_> *)(local_8 + 0x12),(long)local_1b0);
        bin_text_write_fixed
                  (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                   in_stack_fffffffffffffb50,(bool)in_stack_fffffffffffffb4f);
        std::__cxx11::stringstream::~stringstream(local_340);
      }
      else {
        io_buf::bin_read_fixed
                  (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                   in_stack_fffffffffffffc70);
        vVar1 = local_1b4;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_8 + 0x12),
                            (long)local_1b0);
        *pvVar5 = vVar1;
      }
    }
    for (local_344 = 0; local_344 < *local_8; local_344 = local_344 + 1) {
      if ((local_11 & 1) == 0) {
        std::__cxx11::stringstream::stringstream(local_4d0);
        poVar3 = std::operator<<((ostream *)(local_4d0 + 0x10),"v ");
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_8 + 0x18),
                            (long)local_344);
        pvVar4 = (void *)std::ostream::operator<<(poVar3,*pvVar5);
        std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
        std::vector<float,_std::allocator<float>_>::operator[]
                  ((vector<float,_std::allocator<float>_> *)(local_8 + 0x18),(long)local_344);
        bin_text_write_fixed
                  (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                   in_stack_fffffffffffffb50,(bool)in_stack_fffffffffffffb4f);
        std::__cxx11::stringstream::~stringstream(local_4d0);
      }
      else {
        io_buf::bin_read_fixed
                  (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                   in_stack_fffffffffffffc70);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_8 + 0x18),
                            (long)local_344);
        *pvVar5 = local_348;
      }
    }
    if ((local_11 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Saving alpha and v, current weighted_examples = ");
      pvVar4 = (void *)std::ostream::operator<<
                                 (poVar3,*(double *)(**(long **)(local_8 + 10) + 0x20) +
                                         *(double *)(**(long **)(local_8 + 10) + 0x30));
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Loading alpha and v: ");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    for (local_4d4 = 0; local_4d4 < *local_8; local_4d4 = local_4d4 + 1) {
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_8 + 0x12),(long)local_4d4)
      ;
      poVar3 = (ostream *)std::ostream::operator<<(&std::cerr,*pvVar5);
      poVar3 = std::operator<<(poVar3," ");
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_8 + 0x18),(long)local_4d4)
      ;
      pvVar4 = (void *)std::ostream::operator<<(poVar3,*pvVar5);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

void save_load_sampling(boosting& o, io_buf& model_file, bool read, bool text)
{
  if (model_file.files.size() == 0)
    return;
  stringstream os;
  os << "boosts " << o.N << endl;
  bin_text_read_write_fixed(model_file, (char*)&(o.N), sizeof(o.N), "", read, os, text);

  if (read)
  {
    o.alpha.resize(o.N);
    o.v.resize(o.N);
  }

  for (int i = 0; i < o.N; i++)
    if (read)
    {
      float f;
      model_file.bin_read_fixed((char*)&f, sizeof(f), "");
      o.alpha[i] = f;
    }
    else
    {
      stringstream os2;
      os2 << "alpha " << o.alpha[i] << endl;
      bin_text_write_fixed(model_file, (char*)&(o.alpha[i]), sizeof(o.alpha[i]), os2, text);
    }

  for (int i = 0; i < o.N; i++)
    if (read)
    {
      float f;
      model_file.bin_read_fixed((char*)&f, sizeof(f), "");
      o.v[i] = f;
    }
    else
    {
      stringstream os2;
      os2 << "v " << o.v[i] << endl;
      bin_text_write_fixed(model_file, (char*)&(o.v[i]), sizeof(o.v[i]), os2, text);
    }

  if (read)
  {
    cerr << "Loading alpha and v: " << endl;
  }
  else
  {
    cerr << "Saving alpha and v, current weighted_examples = "
         << o.all->sd->weighted_labeled_examples + o.all->sd->weighted_unlabeled_examples << endl;
  }
  for (int i = 0; i < o.N; i++)
  {
    cerr << o.alpha[i] << " " << o.v[i] << endl;
  }
  cerr << endl;
}